

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall csguide_webserver::HttpServer::Run(HttpServer *this,int max_queue_size)

{
  int fd;
  pointer psVar1;
  int epoll_fd;
  HttpData *__p;
  pointer psVar2;
  shared_ptr<csguide_webserver::HttpData> httpData;
  vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
  events;
  ThreadPool threadPool;
  shared_ptr<void> local_148;
  shared_ptr<csguide_webserver::HttpData> local_138;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  ServerSocket *local_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
  local_e8;
  ThreadPool local_d0;
  
  ThreadPool::ThreadPool(&local_d0,this->server_conf_->thread_num,max_queue_size);
  epoll_fd = Epoll::Init(0x400);
  __p = (HttpData *)operator_new(0x58);
  (__p->client_socket_).
  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->client_socket_).
  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->response_).super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->response_).super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
  super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
  super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p->epoll_fd = -1;
  (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<csguide_webserver::HttpData,void>
            ((__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2> *)&local_f8,__p);
  local_f8->epoll_fd = epoll_fd;
  (this->serverSocket).epoll_fd_ = epoll_fd;
  fd = (this->serverSocket).listen_fd_;
  local_138.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_f8;
  local_138.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_f0;
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
    }
  }
  Epoll::Addfd(epoll_fd,fd,0x80000001,&local_138);
  if (local_138.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_100 = &this->serverSocket;
  do {
    Epoll::Poll(&local_e8,local_100,0x400,-1);
    psVar1 = local_e8.
             super__Vector_base<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = local_e8.
                  super__Vector_base<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar2->super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar2->super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
        }
      }
      local_118 = (code *)0x0;
      pcStack_110 = (code *)0x0;
      local_128._M_unused._M_object = (void *)0x0;
      local_128._8_8_ = 0;
      local_128._M_unused._M_object = operator_new(0x18);
      *(code **)local_128._M_unused._0_8_ = DoRequest;
      *(undefined8 *)((long)local_128._M_unused._0_8_ + 8) = 0;
      *(HttpServer **)((long)local_128._M_unused._0_8_ + 0x10) = this;
      pcStack_110 = std::
                    _Function_handler<void_(std::shared_ptr<void>),_std::_Bind<void_(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>_>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<void_(std::shared_ptr<void>),_std::_Bind<void_(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>_>
                  ::_M_manager;
      ThreadPool::Append(&local_d0,&local_148,(function<void_(std::shared_ptr<void>)> *)&local_128);
      if (local_118 != (code *)0x0) {
        (*local_118)(&local_128,&local_128,__destroy_functor);
      }
      if (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
    }
    TimerManager::handle_expired_event((TimerManager *)Epoll::timer_manager_);
    std::
    vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
    ::~vector(&local_e8);
  } while( true );
}

Assistant:

void HttpServer::Run(int max_queue_size) {
  ThreadPool threadPool(server_conf_.thread_num, max_queue_size);
  int epoll_fd = Epoll::Init(1024);
  std::shared_ptr<HttpData> httpData(new HttpData());
  httpData->epoll_fd = epoll_fd;
  serverSocket.epoll_fd_ = epoll_fd;  // 之前就是这里忘了添加,导致穿进去的serverSocket具有不正确的epoll_fd

  __uint32_t event = (EPOLLIN | EPOLLET);
    Epoll::Addfd(epoll_fd, serverSocket.listen_fd_, event, httpData);

  while (true) {
    std::vector<std::shared_ptr<HttpData>> events = Epoll::Poll(serverSocket, 1024, -1);
    // FIXME 将事件传递给 线程池
    for (auto& req : events) {
        threadPool.Append(req, std::bind(&HttpServer::DoRequest, this, std::placeholders::_1));
    }
    // 处理定时器超时事件
    Epoll::timer_manager_.handle_expired_event();
  }
}